

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
          *handler)

{
  long lVar1;
  internal iVar2;
  long *plVar3;
  internal *piVar4;
  uint id;
  internal *piVar5;
  internal *piVar6;
  null_terminating_iterator<char> nVar7;
  basic_string_view<char> name;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_48;
  undefined4 local_38;
  
  plVar3 = (long *)it.end_;
  piVar4 = (internal *)it.ptr_;
  if (this == piVar4) {
    iVar2 = (internal)0x0;
  }
  else {
    iVar2 = *this;
  }
  if ((iVar2 == (internal)0x7d) || (iVar2 == (internal)0x3a)) {
    lVar1 = *plVar3;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    next_arg((format_arg *)&local_48.string,
             (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
              *)(lVar1 + 8));
    *(undefined4 *)(lVar1 + 0x60) = local_38;
    *(longlong *)(lVar1 + 0x50) = local_48.long_long_value;
    *(size_t *)(lVar1 + 0x58) = local_48.string.size;
    piVar6 = this;
  }
  else if ((byte)((char)iVar2 - 0x30U) < 10) {
    if ((this == piVar4) || (9 < (byte)((char)*this - 0x30U))) {
      __assert_fail("\'0\' <= *it && *it <= \'9\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/fmt/format.h"
                    ,0x674,
                    "unsigned int fmt::internal::parse_nonnegative_int(Iterator &, ErrorHandler &&) [Iterator = fmt::internal::null_terminating_iterator<char>, ErrorHandler = fmt::internal::id_adapter<fmt::format_handler<fmt::arg_formatter<fmt::back_insert_range<fmt::internal::basic_buffer<char>>>, char, fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>> &, char> &]"
                   );
    }
    id = 0;
    piVar6 = this + 1;
    do {
      piVar5 = piVar6;
      id = ((int)(char)piVar5[-1] + id * 10) - 0x30;
      piVar6 = piVar4;
      if ((piVar5 == piVar4) || (this = this + 1, piVar6 = this, 9 < (byte)((char)*piVar5 - 0x30U)))
      goto LAB_0011ede7;
      piVar6 = piVar5 + 1;
    } while (id < 0xccccccd);
    id = 0x80000000;
    piVar6 = piVar5;
LAB_0011ede7:
    if ((int)id < 0) {
      error_handler::on_error((error_handler *)*plVar3,"number is too big");
    }
    if ((piVar5 == piVar4) ||
       ((*piVar6 != (internal)0x7d && ((piVar5 == piVar4 || (*piVar6 != (internal)0x3a)))))) {
LAB_0011ee1e:
      error_handler::on_error((error_handler *)*plVar3,"invalid format string");
    }
    format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::on_arg_id((format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 *)*plVar3,id);
  }
  else {
    if ((iVar2 != (internal)0x5f) && (0x19 < (byte)(((byte)iVar2 & 0xdf) + 0xbf)))
    goto LAB_0011ee1e;
    name.size_ = 0;
    piVar5 = this + 1;
    do {
      piVar6 = piVar5;
      if (piVar6 == piVar4) {
        iVar2 = (internal)0x0;
      }
      else {
        iVar2 = *piVar6;
      }
      piVar5 = piVar6 + 1;
      name.size_ = name.size_ + 1;
    } while ((((byte)((char)iVar2 - 0x30U) < 10) || (iVar2 == (internal)0x5f)) ||
            ((byte)(((byte)iVar2 & 0xdf) + 0xbf) < 0x1a));
    if ((long)name.size_ < 0) {
      __assert_fail("(value >= 0) && \"negative value\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/fmt/core.h"
                    ,0xde,
                    "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                   );
    }
    lVar1 = *plVar3;
    name.data_ = (char *)this;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    get_arg((format_arg *)&local_48.string,
            (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
             *)(lVar1 + 8),name);
    *(undefined4 *)(lVar1 + 0x60) = local_38;
    *(longlong *)(lVar1 + 0x50) = local_48.long_long_value;
    *(size_t *)(lVar1 + 0x58) = local_48.string.size;
  }
  nVar7.end_ = (char *)piVar4;
  nVar7.ptr_ = (char *)piVar6;
  return nVar7;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(
            pointer_from(start), to_unsigned(it - start)));
  return it;
}